

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_make_masked_inter_predictor
               (uint8_t *pre,int pre_stride,uint8_t *dst,int dst_stride,
               InterPredParams *inter_pred_params,SubpelParams *subpel_params)

{
  int iVar1;
  CONV_BUF_TYPE *pCVar2;
  long in_R8;
  CONV_BUF_TYPE *tmp_buf16;
  int org_dst_stride;
  CONV_BUF_TYPE *org_dst;
  int tmp_buf_stride;
  uint8_t *tmp_dst;
  uint8_t tmp_buf [32768];
  BLOCK_SIZE sb_type;
  INTERINTER_COMPOUND_DATA *comp_data;
  CONV_BUF_TYPE *local_8090;
  int src1_stride;
  undefined4 in_stack_ffffffffffff7fa0;
  int in_stack_ffffffffffff7fa4;
  InterPredParams *in_stack_ffffffffffff7fa8;
  int in_stack_ffffffffffff7fb4;
  uint8_t *in_stack_ffffffffffff7fb8;
  int in_stack_ffffffffffff7fc4;
  uint8_t *in_stack_ffffffffffff7fc8;
  INTERINTER_COMPOUND_DATA *in_stack_ffffffffffff7ff8;
  BLOCK_SIZE in_stack_ffffffffffff8000;
  int in_stack_ffffffffffff8008;
  int in_stack_ffffffffffff8010;
  InterPredParams *in_stack_ffffffffffff8018;
  
  if (*(int *)(in_R8 + 0xb4) == 0) {
    local_8090 = (CONV_BUF_TYPE *)&stack0xffffffffffff7fa0;
  }
  else {
    local_8090 = (CONV_BUF_TYPE *)((ulong)&stack0xffffffffffff7fa0 >> 1);
  }
  src1_stride = 0x80;
  pCVar2 = *(CONV_BUF_TYPE **)(in_R8 + 0x38);
  iVar1 = *(int *)(in_R8 + 0x40);
  *(undefined1 **)(in_R8 + 0x38) = &stack0xffffffffffff7fa0;
  *(undefined4 *)(in_R8 + 0x40) = 0x80;
  av1_make_inter_predictor
            (in_stack_ffffffffffff7fc8,in_stack_ffffffffffff7fc4,in_stack_ffffffffffff7fb8,
             in_stack_ffffffffffff7fb4,in_stack_ffffffffffff7fa8,
             (SubpelParams *)CONCAT44(in_stack_ffffffffffff7fa4,in_stack_ffffffffffff7fa0));
  if ((*(int *)(in_R8 + 0x4c) == 0) && (*(char *)(in_R8 + 0xc3) == '\x03')) {
    (*av1_build_compound_diffwtd_mask_d16)
              (*(uint8_t **)(in_R8 + 0xb8),*(DIFFWTD_MASK_TYPE *)(in_R8 + 0xc2),pCVar2,iVar1,
               (CONV_BUF_TYPE *)&stack0xffffffffffff7fa0,0x80,*(int *)(in_R8 + 0x74),
               *(int *)(in_R8 + 0x70),(ConvolveParams *)(in_R8 + 0x30),*(int *)(in_R8 + 0xb0));
  }
  build_masked_compound_no_round
            (in_stack_ffffffffffff7fb8,in_stack_ffffffffffff7fb4,
             (CONV_BUF_TYPE *)in_stack_ffffffffffff7fa8,in_stack_ffffffffffff7fa4,local_8090,
             src1_stride,in_stack_ffffffffffff7ff8,in_stack_ffffffffffff8000,
             in_stack_ffffffffffff8008,in_stack_ffffffffffff8010,in_stack_ffffffffffff8018);
  return;
}

Assistant:

void av1_make_masked_inter_predictor(const uint8_t *pre, int pre_stride,
                                     uint8_t *dst, int dst_stride,
                                     InterPredParams *inter_pred_params,
                                     const SubpelParams *subpel_params) {
  const INTERINTER_COMPOUND_DATA *comp_data = &inter_pred_params->mask_comp;
  BLOCK_SIZE sb_type = inter_pred_params->sb_type;

  // We're going to call av1_make_inter_predictor to generate a prediction into
  // a temporary buffer, then will blend that temporary buffer with that from
  // the other reference.
  DECLARE_ALIGNED(32, uint8_t, tmp_buf[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_dst =
      inter_pred_params->use_hbd_buf ? CONVERT_TO_BYTEPTR(tmp_buf) : tmp_buf;

  const int tmp_buf_stride = MAX_SB_SIZE;
  CONV_BUF_TYPE *org_dst = inter_pred_params->conv_params.dst;
  int org_dst_stride = inter_pred_params->conv_params.dst_stride;
  CONV_BUF_TYPE *tmp_buf16 = (CONV_BUF_TYPE *)tmp_buf;
  inter_pred_params->conv_params.dst = tmp_buf16;
  inter_pred_params->conv_params.dst_stride = tmp_buf_stride;
  assert(inter_pred_params->conv_params.do_average == 0);

  // This will generate a prediction in tmp_buf for the second reference
  av1_make_inter_predictor(pre, pre_stride, tmp_dst, MAX_SB_SIZE,
                           inter_pred_params, subpel_params);

  if (!inter_pred_params->conv_params.plane &&
      comp_data->type == COMPOUND_DIFFWTD) {
    av1_build_compound_diffwtd_mask_d16(
        comp_data->seg_mask, comp_data->mask_type, org_dst, org_dst_stride,
        tmp_buf16, tmp_buf_stride, inter_pred_params->block_height,
        inter_pred_params->block_width, &inter_pred_params->conv_params,
        inter_pred_params->bit_depth);
  }
  build_masked_compound_no_round(
      dst, dst_stride, org_dst, org_dst_stride, tmp_buf16, tmp_buf_stride,
      comp_data, sb_type, inter_pred_params->block_height,
      inter_pred_params->block_width, inter_pred_params);
}